

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

uint __thiscall IntrusiveList<TypeHandle>::size(IntrusiveList<TypeHandle> *this)

{
  TypeHandle *local_20;
  TypeHandle *curr;
  uint count;
  IntrusiveList<TypeHandle> *this_local;
  
  curr._4_4_ = 0;
  for (local_20 = this->head; local_20 != (TypeHandle *)0x0; local_20 = local_20->next) {
    curr._4_4_ = curr._4_4_ + 1;
  }
  return curr._4_4_;
}

Assistant:

unsigned size() const
	{
		unsigned count = 0;

		T *curr = head;

		while(curr)
		{
			count++;

			curr = static_cast<T*>(curr->next);
		}

		return count;
	}